

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O0

basic_binary_istream<fail_flag_serialization_policy> *
detail::operator>>(istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                   *stream,map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *value)

{
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *value_00;
  span<const_std::byte> *psVar1;
  type_conflict1 *ptVar2;
  pair<unsigned_long,_bool> pVar3;
  type *success;
  type *_;
  span<const_std::byte> local_40;
  pair<unsigned_long,_bool> local_30;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_20;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *value_local;
  istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
  *stream_local;
  
  local_20 = value;
  value_local = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)stream
  ;
  if (((stream->
       super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
       ).super_fail_flag_serialization_policy.overflow & 1U) == 0) {
    psVar1 = stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
             ::span(&stream->
                     super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                   );
    span<std::byte_const>::span<span<std::byte_const>&,void>
              ((span<std::byte_const> *)&local_40,psVar1);
    pVar3 = try_get_deserialized_size<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                      (local_40);
    local_30.first = pVar3.first;
    local_30.second = pVar3.second;
    std::get<0ul,unsigned_long,bool>(&local_30);
    ptVar2 = std::get<1ul,unsigned_long,bool>(&local_30);
    value_00 = local_20;
    if ((*ptVar2 & 1U) == 0) {
      *(undefined1 *)&(value_local->_M_t)._M_impl = 1;
      stream_local = (istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                      *)stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                        ::base((stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                                *)value_local);
    }
    else {
      psVar1 = stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
               ::span((stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                       *)value_local);
      deserialize<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                (value_00,psVar1);
      stream_local = (istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                      *)stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                        ::base((stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                                *)value_local);
    }
  }
  else {
    stream_local = (istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                    *)stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                      ::base(&stream->
                              super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                            );
  }
  return (basic_binary_istream<fail_flag_serialization_policy> *)stream_local;
}

Assistant:

StreamDerived& operator>>(istream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T& value) {
        if (stream.overflow) return stream.base();

        auto const [_, success] = try_get_deserialized_size<T>(stream.span());
        if (!success) {
            stream.overflow = true;
            return stream.base();
        }
        deserialize(value, stream.span());
        return stream.base();
    }